

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O0

string * __thiscall
soul::CompileMessage::getFullDescriptionWithoutFilename_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  bool bVar1;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  string filename;
  CompileMessage *this_local;
  
  filename.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = hasPosition(this);
  if (bVar1) {
    getPositionString_abi_cxx11_(&local_88,this);
    std::operator+(&local_68,&local_88,": ");
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  getSeverity_abi_cxx11_(&local_e8,this);
  std::operator+(&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_e8);
  std::operator+(&local_a8,&local_c8,": ");
  std::operator+(__return_storage_ptr__,&local_a8,&this->description);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getFullDescriptionWithoutFilename() const
{
    std::string filename;

    if (hasPosition())
        filename = getPositionString() + ": ";

    return filename + getSeverity() + ": " + description;
}